

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall fasttext::FastText::loadVectors(FastText *this,string *filename)

{
  element_type *peVar1;
  char cVar2;
  int32_t iVar3;
  uint uVar4;
  istream *piVar5;
  invalid_argument *piVar6;
  size_t j;
  ulong uVar7;
  EVP_PKEY_CTX *ctx;
  long lVar8;
  size_t i;
  ulong uVar9;
  long lVar10;
  int64_t dim;
  string word;
  int64_t n;
  shared_ptr<fasttext::Matrix> mat;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  string local_2b8;
  string local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ifstream in;
  
  std::ifstream::ifstream(&in,(string *)filename,_S_in);
  words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mat.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  mat.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(&word,filename," cannot be opened for loading!");
    std::invalid_argument::invalid_argument(piVar6,(string *)&word);
    __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  piVar5 = std::istream::_M_extract<long>((long *)&in);
  std::istream::_M_extract<long>((long *)piVar5);
  if (dim == ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             dim) {
    std::make_shared<fasttext::Matrix,long&,long&>((long *)&word,&n);
    std::__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&mat.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2> *)&word);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&word._M_string_length);
    for (uVar9 = 0; uVar9 < (ulong)n; uVar9 = uVar9 + 1) {
      word._M_dataplus._M_p = (pointer)&word.field_2;
      word._M_string_length = 0;
      word.field_2._M_local_buf[0] = '\0';
      std::operator>>((istream *)&in,(string *)&word);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&words,&word);
      Dictionary::add((this->dict_).
                      super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      &word);
      for (uVar7 = 0; uVar7 < (ulong)dim; uVar7 = uVar7 + 1) {
        std::istream::_M_extract<float>((float *)&in);
      }
      std::__cxx11::string::~string((string *)&word);
    }
    std::ifstream::close();
    ctx = (EVP_PKEY_CTX *)0x1;
    Dictionary::threshold
              ((this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,1,0);
    Dictionary::init((this->dict_).
                     super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr,ctx
                    );
    iVar3 = Dictionary::nwords((this->dict_).
                               super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
    local_2d8._M_dataplus._M_p._0_4_ =
         iVar3 + ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->bucket;
    std::make_shared<fasttext::Matrix,int,int&>((int *)&word,(int *)&local_2d8);
    std::__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2> *)&word);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&word._M_string_length);
    Matrix::uniform((this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,1.0 / (float)((this->args_).
                                         super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->dim);
    lVar10 = 0;
    for (uVar9 = 0; uVar9 < (ulong)n; uVar9 = uVar9 + 1) {
      uVar4 = Dictionary::getId((this->dict_).
                                super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr,words.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + uVar9);
      if (-1 < (int)uVar4) {
        iVar3 = Dictionary::nwords((this->dict_).
                                   super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
        if ((int)uVar4 < iVar3) {
          peVar1 = (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          for (lVar8 = 0; dim != lVar8; lVar8 = lVar8 + 1) {
            *(undefined4 *)
             (peVar1->n_ * (ulong)uVar4 * 4 +
              (long)(peVar1->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar8 * 4) =
                 *(undefined4 *)
                  ((long)((mat.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start +
                  lVar8 * 4 +
                  (mat.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->n_
                  * lVar10);
          }
        }
      }
      lVar10 = lVar10 + 4;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&mat.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&words);
    std::ifstream::~ifstream(&in);
    return;
  }
  piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_298,dim);
  std::operator+(&local_278,"Dimension of pretrained vectors (",&local_298);
  std::operator+(&local_258,&local_278,") does not match dimension (");
  std::__cxx11::to_string
            (&local_2b8,
             ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             dim);
  std::operator+(&local_2d8,&local_258,&local_2b8);
  std::operator+(&word,&local_2d8,")!");
  std::invalid_argument::invalid_argument(piVar6,(string *)&word);
  __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void FastText::loadVectors(std::string filename) {
  std::ifstream in(filename);
  std::vector<std::string> words;
  std::shared_ptr<Matrix> mat; // temp. matrix for pretrained vectors
  int64_t n, dim;
  if (!in.is_open()) {
    throw std::invalid_argument(filename + " cannot be opened for loading!");
  }
  in >> n >> dim;
  if (dim != args_->dim) {
    throw std::invalid_argument(
        "Dimension of pretrained vectors (" + std::to_string(dim) +
        ") does not match dimension (" + std::to_string(args_->dim) + ")!");
  }
  mat = std::make_shared<Matrix>(n, dim);
  for (size_t i = 0; i < n; i++) {
    std::string word;
    in >> word;
    words.push_back(word);
    dict_->add(word);
    for (size_t j = 0; j < dim; j++) {
      in >> mat->at(i, j);
    }
  }
  in.close();

  dict_->threshold(1, 0);
  dict_->init();
  input_ = std::make_shared<Matrix>(dict_->nwords()+args_->bucket, args_->dim);
  input_->uniform(1.0 / args_->dim);

  for (size_t i = 0; i < n; i++) {
    int32_t idx = dict_->getId(words[i]);
    if (idx < 0 || idx >= dict_->nwords()) continue;
    for (size_t j = 0; j < dim; j++) {
      input_->at(idx, j) = mat->at(i, j);
    }
  }
}